

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_parse_result *
pugi::impl::anon_unknown_0::load_buffer_impl
          (xml_parse_result *__return_storage_ptr__,xml_document_struct *doc,xml_node_struct *root,
          void *contents,size_t size,uint options,xml_encoding encoding,bool is_mutable,bool own,
          char_t **out_buffer)

{
  byte endch;
  byte bVar1;
  undefined *puVar2;
  bool bVar3;
  xml_encoding xVar4;
  xml_parse_result *extraout_RAX;
  xml_parse_result *pxVar5;
  xml_parse_result *extraout_RAX_00;
  size_t sVar6;
  size_t sVar7;
  xml_node_struct *pxVar8;
  xml_node_struct *pxVar9;
  long lVar10;
  xml_attribute_struct *pxVar11;
  char_t *pcVar12;
  xml_node_struct **ppxVar13;
  byte bVar14;
  byte bVar15;
  ushort uVar16;
  uint uVar17;
  uint uVar18;
  char *__function;
  ulong uVar19;
  byte *pbVar20;
  uint uVar21;
  int iVar22;
  ushort *puVar23;
  ushort *puVar24;
  long lVar25;
  xml_parse_result *pxVar26;
  ulong uVar27;
  ushort uVar28;
  xml_allocator *alloc;
  long lVar29;
  byte *pbVar30;
  byte *pbVar31;
  byte *pbVar32;
  void *pvVar33;
  byte *pbVar34;
  byte *pbVar35;
  size_t length;
  char_t *buffer;
  xml_parse_result result;
  xml_parse_result *local_d0;
  xml_parse_result *local_c0;
  byte *local_b8;
  xml_parse_result *local_b0;
  byte *local_a8;
  xml_parse_result *pxStack_a0;
  xml_encoding local_98;
  undefined4 uStack_94;
  byte *local_88;
  xml_parse_result *local_80;
  uint local_74;
  xml_node_struct *local_70;
  xml_node_struct *local_68;
  byte *local_60;
  xml_node_struct **local_58;
  code *local_50;
  code *local_48;
  byte *local_40;
  xml_parse_result *local_38;
  
  if (size != 0 && contents == (void *)0x0) {
    xml_parse_result::xml_parse_result(__return_storage_ptr__);
    __return_storage_ptr__->status = status_io_error;
    __return_storage_ptr__->offset = 0;
    return extraout_RAX;
  }
  local_68 = root;
  xVar4 = get_buffer_encoding(encoding,contents,size);
  puVar2 = (anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate;
  pvVar33 = (void *)0x0;
  if (own) {
    pvVar33 = contents;
  }
  local_b8 = (byte *)0x0;
  local_c0 = (xml_parse_result *)0x0;
  local_b0 = __return_storage_ptr__;
  if (xVar4 == encoding_utf8) goto LAB_00191ab8;
  if ((xVar4 & ~encoding_utf8) == encoding_utf16_le) {
    uVar27 = size >> 1;
    lVar10 = 0;
    if (xVar4 == encoding_utf16_le) {
      uVar19 = uVar27;
      puVar23 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar16 = *puVar23;
          if (uVar16 < 0xd800) {
            lVar25 = 3 - (ulong)(uVar16 < 0x800);
            if (uVar16 < 0x80) {
              lVar25 = 1;
            }
            lVar10 = lVar10 + lVar25;
LAB_00191c81:
            puVar24 = puVar23 + 1;
            lVar25 = -1;
          }
          else {
            if ((~uVar16 & 0xe000) == 0) {
              lVar10 = lVar10 + 3;
              goto LAB_00191c81;
            }
            puVar24 = puVar23 + 1;
            lVar25 = -1;
            if (((uVar19 != 1) && ((uVar16 & 0xfc00) == 0xd800)) && ((*puVar24 & 0xfc00) == 0xdc00))
            {
              lVar10 = lVar10 + 4;
              puVar24 = puVar23 + 2;
              lVar25 = -2;
            }
          }
          uVar19 = uVar19 + lVar25;
          puVar23 = puVar24;
        } while (uVar19 != 0);
      }
      local_d0 = (xml_parse_result *)(lVar10 + 1);
      pbVar34 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>
                                  ::allocate)();
      if (pbVar34 == (byte *)0x0) goto LAB_00191ade;
      pbVar30 = pbVar34;
      puVar23 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar16 = *puVar23;
          uVar21 = (uint)uVar16;
          if ((uVar16 < 0xd800) || ((~uVar16 & 0xe000) == 0)) {
            pbVar30 = utf8_writer::low(pbVar30,uVar21);
            puVar24 = puVar23 + 1;
            lVar25 = -1;
          }
          else {
            puVar24 = puVar23 + 1;
            lVar25 = -1;
            if ((uVar27 != 1) && ((uVar21 & 0xfc00) == 0xd800)) {
              uVar16 = *puVar24;
              if ((uVar16 & 0xfc00) == 0xdc00) {
                uVar17 = (uVar21 << 10 & 0xffc00) + 0x10000;
                *pbVar30 = (byte)(uVar17 >> 0x12) | 0xf0;
                pbVar30[1] = (byte)(uVar17 >> 0xc) & 0x3f | 0x80;
                pbVar30[2] = (byte)((uVar16 & 0x3c0 | uVar21 << 10) >> 6) & 0x3f | 0x80;
                pbVar30[3] = (byte)uVar16 & 0x3f | 0x80;
                pbVar30 = pbVar30 + 4;
                puVar24 = puVar23 + 2;
                lVar25 = -2;
              }
            }
          }
          uVar27 = uVar27 + lVar25;
          puVar23 = puVar24;
        } while (uVar27 != 0);
      }
      if (pbVar30 != pbVar34 + lVar10) {
        __function = 
        "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
        ;
LAB_001933ed:
        __assert_fail("oend == obegin + length",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                      ,0x8b1,__function);
      }
    }
    else {
      uVar19 = uVar27;
      puVar23 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar16 = *puVar23 << 8;
          uVar28 = uVar16 | *puVar23 >> 8;
          if (uVar28 < 0xd800) {
            lVar25 = 3 - (ulong)(uVar28 < 0x800);
            if (uVar28 < 0x80) {
              lVar25 = 1;
            }
            lVar10 = lVar10 + lVar25;
LAB_00191d43:
            puVar24 = puVar23 + 1;
            lVar25 = -1;
          }
          else {
            if ((~uVar28 & 0xe000) == 0) {
              lVar10 = lVar10 + 3;
              goto LAB_00191d43;
            }
            puVar24 = puVar23 + 1;
            lVar25 = -1;
            if (((uVar19 != 1) && ((uVar16 & 0xfc00) == 0xd800)) && ((*puVar24 & 0xfc) == 0xdc)) {
              lVar10 = lVar10 + 4;
              puVar24 = puVar23 + 2;
              lVar25 = -2;
            }
          }
          uVar19 = uVar19 + lVar25;
          puVar23 = puVar24;
        } while (uVar19 != 0);
      }
      local_d0 = (xml_parse_result *)(lVar10 + 1);
      pbVar34 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>
                                  ::allocate)();
      if (pbVar34 == (byte *)0x0) goto LAB_00191ade;
      pbVar30 = pbVar34;
      puVar23 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar16 = *puVar23 << 8 | *puVar23 >> 8;
          uVar21 = (uint)uVar16;
          if ((uVar16 < 0xd800) || ((~uVar16 & 0xe000) == 0)) {
            pbVar30 = utf8_writer::low(pbVar30,uVar21);
            puVar24 = puVar23 + 1;
            lVar25 = -1;
          }
          else {
            puVar24 = puVar23 + 1;
            lVar25 = -1;
            if ((uVar27 != 1) && ((uVar21 & 0xfc00) == 0xd800)) {
              uVar16 = *puVar24;
              uVar17 = (uint)(ushort)(uVar16 << 8 | uVar16 >> 8);
              if ((uVar17 & 0xfc00) == 0xdc00) {
                uVar18 = (uVar21 << 10 & 0xffc00) + 0x10000;
                *pbVar30 = (byte)(uVar18 >> 0x12) | 0xf0;
                pbVar30[1] = (byte)(uVar18 >> 0xc) & 0x3f | 0x80;
                pbVar30[2] = (byte)((uVar17 & 0x3c0 | uVar21 << 10) >> 6) & 0x3f | 0x80;
                pbVar30[3] = (byte)(uVar16 >> 8) & 0x3f | 0x80;
                pbVar30 = pbVar30 + 4;
                puVar24 = puVar23 + 2;
                lVar25 = -2;
              }
            }
          }
          uVar27 = uVar27 + lVar25;
          puVar23 = puVar24;
        } while (uVar27 != 0);
      }
      if (pbVar30 != pbVar34 + lVar10) {
        __function = 
        "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
        ;
        goto LAB_001933ed;
      }
    }
LAB_00192154:
    *pbVar30 = 0;
    local_b8 = pbVar34;
LAB_0019215c:
    local_c0 = local_d0;
  }
  else {
    if (xVar4 - encoding_utf32_le < 2) {
      uVar27 = size >> 2;
      if (xVar4 == encoding_utf32_le) {
        if (size < 4) {
          lVar10 = 0;
        }
        else {
          uVar19 = 0;
          lVar10 = 0;
          do {
            uVar21 = *(uint *)((long)contents + uVar19 * 4);
            if (uVar21 < 0x10000) {
              lVar25 = 3 - (ulong)(uVar21 < 0x800);
              if (uVar21 < 0x80) {
                lVar25 = 1;
              }
              lVar10 = lVar10 + lVar25;
            }
            else {
              lVar10 = lVar10 + 4;
            }
            uVar19 = uVar19 + 1;
          } while (uVar27 != uVar19);
        }
        local_d0 = (xml_parse_result *)(lVar10 + 1);
        pbVar34 = (byte *)(*(code *)(anonymous_namespace)::
                                    xml_memory_management_function_storage<int>::allocate)();
        if (pbVar34 == (byte *)0x0) goto LAB_00191ade;
        pbVar30 = pbVar34;
        if (3 < size) {
          uVar19 = 0;
          do {
            uVar21 = *(uint *)((long)contents + uVar19 * 4);
            if (uVar21 < 0x10000) {
              pbVar30 = utf8_writer::low(pbVar30,uVar21);
            }
            else {
              *pbVar30 = (byte)(uVar21 >> 0x12) | 0xf0;
              pbVar30[1] = (byte)(uVar21 >> 0xc) & 0x3f | 0x80;
              pbVar30[2] = (byte)(uVar21 >> 6) & 0x3f | 0x80;
              pbVar30[3] = (byte)uVar21 & 0x3f | 0x80;
              pbVar30 = pbVar30 + 4;
            }
            uVar19 = uVar19 + 1;
          } while (uVar27 != uVar19);
        }
        if (pbVar30 != pbVar34 + lVar10) {
          __function = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
          ;
          goto LAB_001933ed;
        }
      }
      else {
        if (size < 4) {
          lVar10 = 0;
        }
        else {
          uVar19 = 0;
          lVar10 = 0;
          do {
            uVar21 = *(uint *)((long)contents + uVar19 * 4);
            uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                     uVar21 << 0x18;
            if (uVar21 < 0x10000) {
              lVar25 = 3 - (ulong)(uVar21 < 0x800);
              if (uVar21 < 0x80) {
                lVar25 = 1;
              }
              lVar10 = lVar10 + lVar25;
            }
            else {
              lVar10 = lVar10 + 4;
            }
            uVar19 = uVar19 + 1;
          } while (uVar27 != uVar19);
        }
        local_d0 = (xml_parse_result *)(lVar10 + 1);
        pbVar34 = (byte *)(*(code *)(anonymous_namespace)::
                                    xml_memory_management_function_storage<int>::allocate)();
        if (pbVar34 == (byte *)0x0) goto LAB_00191ade;
        pbVar30 = pbVar34;
        if (3 < size) {
          uVar19 = 0;
          do {
            uVar21 = *(uint *)((long)contents + uVar19 * 4);
            uVar17 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                     uVar21 << 0x18;
            if (uVar17 < 0x10000) {
              pbVar30 = utf8_writer::low(pbVar30,uVar17);
            }
            else {
              *pbVar30 = (byte)(uVar17 >> 0x12) | 0xf0;
              pbVar30[1] = (byte)(uVar17 >> 0xc) & 0x3f | 0x80;
              pbVar30[2] = (byte)(uVar17 >> 6) & 0x3f | 0x80;
              pbVar30[3] = (byte)(uVar21 >> 0x18) & 0x3f | 0x80;
              pbVar30 = pbVar30 + 4;
            }
            uVar19 = uVar19 + 1;
          } while (uVar27 != uVar19);
        }
        if (pbVar30 != pbVar34 + lVar10) {
          __function = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
          ;
          goto LAB_001933ed;
        }
      }
      goto LAB_00192154;
    }
    if (xVar4 != encoding_latin1) {
      __assert_fail("false && \"Invalid encoding\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                    ,0x906,
                    "bool pugi::impl::(anonymous namespace)::convert_buffer(char_t *&, size_t &, xml_encoding, const void *, size_t, bool)"
                   );
    }
    sVar6 = 0;
    if (size == 0) {
LAB_00191dad:
      if (size == sVar6) goto LAB_00191ab8;
      if (size == sVar6) {
        lVar10 = 0;
      }
      else {
        lVar10 = 0;
        sVar7 = sVar6;
        do {
          lVar10 = (lVar10 - (ulong)(-1 < *(char *)((long)contents + sVar7))) + 2;
          sVar7 = sVar7 + 1;
        } while (size != sVar7);
      }
      local_d0 = (xml_parse_result *)(lVar10 + sVar6 + 1);
      pbVar34 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>
                                  ::allocate)();
      if (pbVar34 == (byte *)0x0) goto LAB_00191ade;
      lVar10 = lVar10 + sVar6;
      memcpy(pbVar34,contents,sVar6);
      pbVar30 = pbVar34 + sVar6;
      for (; size != sVar6; sVar6 = sVar6 + 1) {
        pbVar30 = utf8_writer::low(pbVar30,(uint)*(byte *)((long)contents + sVar6));
      }
      if (pbVar30 != pbVar34 + lVar10) {
        __assert_fail("oend == obegin + length",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                      ,0x8df,
                      "bool pugi::impl::(anonymous namespace)::convert_buffer_latin1(char_t *&, size_t &, const void *, size_t, bool)"
                     );
      }
      *pbVar30 = 0;
      local_b8 = pbVar34;
      goto LAB_0019215c;
    }
    do {
      if (*(char *)((long)contents + sVar6) < '\0') {
        if (size < sVar6) {
          __assert_fail("prefix_length <= data_length",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                        ,0x8ca,
                        "bool pugi::impl::(anonymous namespace)::convert_buffer_latin1(char_t *&, size_t &, const void *, size_t, bool)"
                       );
        }
        goto LAB_00191dad;
      }
      sVar6 = sVar6 + 1;
    } while (size != sVar6);
LAB_00191ab8:
    bVar3 = get_mutable_buffer((char_t **)&local_b8,(size_t *)&local_c0,contents,size,is_mutable);
    if (!bVar3) {
LAB_00191ade:
      xml_parse_result::xml_parse_result(local_b0);
      local_b0->status = status_out_of_memory;
      local_b0->offset = 0;
      if (pvVar33 == (void *)0x0) {
        return local_b0;
      }
      pxVar5 = (xml_parse_result *)(*(code *)puVar2)(pvVar33);
      return pxVar5;
    }
  }
  pbVar34 = local_b8;
  if (own) {
    if (contents != (void *)0x0 && local_b8 != (byte *)contents) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (contents);
    }
LAB_001921a3:
    *out_buffer = (char_t *)pbVar34;
  }
  else if (local_b8 != (byte *)contents) goto LAB_001921a3;
  pxVar5 = local_b0;
  doc->buffer = (char_t *)pbVar34;
  if (local_c0 == (xml_parse_result *)0x0) {
    xml_parse_result::xml_parse_result(local_b0);
    pxVar5->status = ~options >> 8 & status_no_document_element;
    pxVar5->offset = 0;
    pxStack_a0 = extraout_RAX_00;
LAB_001932e5:
    pxVar5->encoding = xVar4;
    return pxStack_a0;
  }
  if (local_68->first_child == (xml_node_struct *)0x0) {
    local_70 = (xml_node_struct *)0x0;
  }
  else {
    local_70 = local_68->first_child->prev_sibling_c;
  }
  endch = (pbVar34 + -1)[(long)local_c0];
  (pbVar34 + -1)[(long)local_c0] = 0;
  local_88 = pbVar34;
  if ((*pbVar34 == 0xef) && (pbVar34[1] == 0xbb)) {
    local_88 = pbVar34 + (ulong)(pbVar34[2] == 0xbf) * 3;
  }
  local_40 = pbVar34;
  local_58 = &local_68->first_child;
  alloc = &doc->super_xml_allocator;
  local_38 = local_c0;
  local_80 = (xml_parse_result *)&local_c0[-1].field_0x17;
  local_48 = *(code **)((long)&PTR_parse_simple_001f69a8 + (ulong)(options >> 1 & 0x78));
  local_50 = (code *)(&PTR_parse_001f6a28)[options >> 9 & 4 | options >> 4 & 3];
  local_74 = options & 0x22;
  bVar1 = endch ^ 0x3e;
  pxVar8 = local_68;
  pbVar34 = local_88;
LAB_001922ec:
  uVar27 = (ulong)*pbVar34;
  while( true ) {
    pbVar30 = pbVar34;
    if ((char)uVar27 == '\0') goto LAB_00192fdc;
    if ((int)uVar27 == 0x3c) goto LAB_00192377;
    bVar14 = (anonymous_namespace)::chartype_table[uVar27];
    pbVar34 = pbVar30;
    while ((bVar14 & 8) != 0) {
      uVar27 = (ulong)pbVar34[1];
      pbVar34 = pbVar34 + 1;
      bVar14 = (anonymous_namespace)::chartype_table[uVar27];
    }
    if (((char)uVar27 != '<') && ((int)uVar27 != 0)) break;
    if (pbVar30 == pbVar34) {
      __assert_fail("mark != s",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                    ,0xd89,
                    "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                   );
    }
    if (((options >> 0xb & 1) == 0 && (options & 0x408) != 0) &&
       (((options >> 10 & 1) == 0 ||
        ((((char)uVar27 == '<' && (pbVar34[1] == 0x2f)) &&
         (pxVar8->first_child == (xml_node_struct *)0x0)))))) break;
  }
  if ((options >> 0xb & 1) != 0) {
    pbVar30 = pbVar34;
  }
  if (((options >> 0xc & 1) != 0) || (pxVar8->parent != (xml_node_struct *)0x0)) {
    pbVar31 = (byte *)(*local_50)(pbVar30);
    pbVar34 = local_88;
    if ((((options >> 0xd & 1) == 0) ||
        ((pxVar8->parent == (xml_node_struct *)0x0 ||
         (pxVar8->first_child != (xml_node_struct *)0x0)))) || (pxVar8->value != (char_t *)0x0)) {
      if ((((options >> 0xe & 1) != 0) && (pxVar8->first_child != (xml_node_struct *)0x0)) &&
         (pxVar9 = pxVar8->first_child->prev_sibling_c, (pxVar9->header & 0xf) == 3)) {
        if (local_88 < pxVar9->value) {
          __assert_fail("merged_pcdata >= cursor->first_child->prev_sibling_c->value",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                        ,0xda4,
                        "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                       );
        }
        sVar6 = strlength((char_t *)local_88);
        sVar7 = strlen((char *)pbVar30);
        memmove(pbVar34 + sVar6,pbVar30,sVar7 + 1);
        local_88 = pbVar34 + sVar6 + sVar7;
        goto LAB_00192455;
      }
      pxVar9 = append_new_node(pxVar8,alloc,node_pcdata);
      if (pxVar9 != (xml_node_struct *)0x0) {
        pxVar9->value = (char_t *)pbVar30;
        local_88 = pbVar30;
        goto LAB_00192455;
      }
LAB_0019310d:
      iVar22 = 3;
      pbVar35 = pbVar31;
    }
    else {
      pxVar8->value = (char_t *)pbVar30;
LAB_00192455:
      bVar14 = *pbVar31;
      pbVar30 = pbVar31;
      if (bVar14 != 0) goto LAB_0019246f;
LAB_00192fdc:
      pbVar35 = (byte *)0x0;
      if (pxVar8 != local_68) {
        pbVar35 = pbVar30;
      }
      iVar22 = 0xe;
      if (pxVar8 == local_68) {
        iVar22 = 0;
      }
    }
    goto LAB_001931f4;
  }
  while( true ) {
    if (*pbVar30 == 0) goto LAB_00192fdc;
    if (*pbVar30 == 0x3c) break;
    pbVar30 = pbVar30 + 1;
  }
LAB_00192377:
  bVar14 = pbVar30[1];
  pbVar31 = pbVar30 + 1;
LAB_0019246f:
  pbVar35 = pbVar31;
  if (-1 < (char)(anonymous_namespace)::chartype_table[bVar14]) {
    if (bVar14 == 0x21) {
      bVar14 = pbVar31[1];
      if (bVar14 == 0x5b) {
        if (pbVar31[2] == 0x43) {
          if (pbVar31[3] != 0x44) {
            pbVar31 = pbVar31 + 3;
            goto LAB_001931e9;
          }
          if (pbVar31[4] != 0x41) {
            pbVar31 = pbVar31 + 4;
            goto LAB_001931e9;
          }
          if (pbVar31[5] != 0x54) {
            pbVar31 = pbVar31 + 5;
            goto LAB_001931e9;
          }
          if (pbVar31[6] != 0x41) {
            pbVar31 = pbVar31 + 6;
            goto LAB_001931e9;
          }
          if (pbVar31[7] != 0x5b) {
            pbVar31 = pbVar31 + 7;
            goto LAB_001931e9;
          }
          pbVar31 = pbVar31 + 8;
          if ((options & 4) == 0) {
            do {
              if (*pbVar31 == 0x5d) {
                if (pbVar31[1] == 0x5d) {
                  if ((pbVar31[2] == 0x3e) || ((endch ^ 0x3e) == 0 && pbVar31[2] == 0))
                  goto LAB_00192eea;
                }
              }
              else if (*pbVar31 == 0) goto LAB_001931e9;
              pbVar31 = pbVar31 + 1;
            } while( true );
          }
          pxVar9 = append_new_node(pxVar8,alloc,node_cdata);
          if (pxVar9 == (xml_node_struct *)0x0) goto LAB_0019310d;
          pxVar9->value = (char_t *)pbVar31;
          if ((options & 0x20) == 0) {
            do {
              if (*pbVar31 == 0x5d) {
                if (pbVar31[1] == 0x5d) {
                  if ((pbVar31[2] == 0x3e) || (bVar1 == 0 && pbVar31[2] == 0)) goto LAB_00192ee6;
                }
              }
              else if (*pbVar31 == 0) goto LAB_001931e9;
              pbVar31 = pbVar31 + 1;
            } while( true );
          }
          pbVar31 = (byte *)strconv_cdata((char_t *)pbVar31,endch);
          if (pbVar31 != (byte *)0x0) goto LAB_00192eed;
          iVar22 = 8;
          pbVar35 = (byte *)pxVar9->value;
        }
        else {
          pbVar31 = pbVar31 + 2;
LAB_001931e9:
          iVar22 = 8;
          pbVar35 = pbVar31;
        }
        goto LAB_001931f4;
      }
      pbVar35 = pbVar31 + 1;
      if (bVar14 != 0x44) {
        if (bVar14 == 0x2d) {
          if (pbVar31[2] == 0x2d) {
            pbVar31 = pbVar31 + 3;
            pxVar9 = pxVar8;
            if ((options & 2) == 0) {
LAB_001926a1:
              if (local_74 != 0x22) {
                do {
                  if (*pbVar31 == 0x2d) {
                    if (pbVar31[1] == 0x2d) {
                      bVar14 = pbVar31[2];
                      if ((bVar14 == 0x3e) || (endch == 0x3e && bVar14 == 0)) goto LAB_00192e69;
                    }
                  }
                  else if (*pbVar31 == 0) goto LAB_001931bd;
                  pbVar31 = pbVar31 + 1;
                } while( true );
              }
              local_a8 = (byte *)0x0;
              pxStack_a0 = (xml_parse_result *)0x0;
LAB_001926bc:
              do {
                pbVar34 = pbVar31;
                pxVar5 = pxStack_a0;
                bVar14 = *pbVar34;
                if (((anonymous_namespace)::chartype_table[bVar14] & 0x20) == 0) {
                  pbVar30 = pbVar34 + 2;
                  do {
                    pbVar34 = pbVar30;
                    bVar14 = pbVar34[-1];
                    if (((anonymous_namespace)::chartype_table[bVar14] & 0x20) != 0) {
                      pbVar34 = pbVar34 + -1;
                      goto LAB_0019270f;
                    }
                    bVar14 = *pbVar34;
                    if (((anonymous_namespace)::chartype_table[bVar14] & 0x20) != 0)
                    goto LAB_0019270f;
                    bVar14 = pbVar34[1];
                    if (((anonymous_namespace)::chartype_table[bVar14] & 0x20) != 0) {
                      pbVar34 = pbVar34 + 1;
                      goto LAB_0019270f;
                    }
                    bVar14 = pbVar34[2];
                    pbVar30 = pbVar34 + 4;
                  } while (((anonymous_namespace)::chartype_table[bVar14] & 0x20) == 0);
                  pbVar34 = pbVar34 + 2;
                }
LAB_0019270f:
                if (bVar14 != 0xd) {
                  if (bVar14 == 0x2d) {
                    if ((pbVar34[1] == 0x2d) &&
                       ((pbVar34[2] == 0x3e || (endch == 0x3e && pbVar34[2] == 0))))
                    goto LAB_00192e87;
                  }
                  else if (bVar14 == 0) {
                    iVar22 = 7;
                    pbVar35 = (byte *)pxVar9->value;
                    goto LAB_001931f4;
                  }
                  pbVar31 = pbVar34 + 1;
                  goto LAB_001926bc;
                }
                pbVar31 = pbVar34 + 1;
                *pbVar34 = 10;
                if (pbVar34[1] == 10) {
                  if (local_a8 != (byte *)0x0) {
                    if (pbVar31 < local_a8) {
                      __assert_fail("s >= end",
                                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                                    ,0x999,
                                    "void pugi::impl::(anonymous namespace)::gap::push(char_t *&, size_t)"
                                   );
                    }
                    memmove(local_a8 + -(long)pxStack_a0,local_a8,(long)pbVar31 - (long)local_a8);
                  }
                  local_a8 = pbVar34 + 2;
                  pxStack_a0 = (xml_parse_result *)((long)pxVar5 + 1);
                  pbVar31 = local_a8;
                }
              } while( true );
            }
            pxVar9 = append_new_node(pxVar8,alloc,node_comment);
            if (pxVar9 != (xml_node_struct *)0x0) {
              pxVar9->value = (char_t *)pbVar31;
              goto LAB_001926a1;
            }
            goto LAB_0019310d;
          }
          pbVar31 = pbVar31 + 2;
LAB_001931bd:
          iVar22 = 7;
          pbVar35 = pbVar31;
        }
        else if ((endch != 0x2d) || (iVar22 = 7, bVar14 != 0)) {
          iVar22 = (uint)(endch == 0x5b && bVar14 == 0) * 3 + 5;
        }
        goto LAB_001931f4;
      }
      if ((((pbVar31[2] == 0x4f) && (pbVar31[3] == 0x43)) && (pbVar31[4] == 0x54)) &&
         ((pbVar31[5] == 0x59 && (pbVar31[6] == 0x50)))) {
        if ((pbVar31[7] == 0x45) || (endch == 0x45 && pbVar31[7] == 0)) {
          if (pxVar8->parent != (xml_node_struct *)0x0) {
            iVar22 = 9;
            pbVar35 = pbVar31 + -1;
            goto LAB_001931f4;
          }
          bVar14 = pbVar31[-1];
          if ((bVar14 != 0x3c) && (bVar14 != 0)) {
            __assert_fail("(s[0] == \'<\' || s[0] == 0) && s[1] == \'!\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                          ,0xbda,
                          "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_doctype_group(char_t *, char_t)"
                         );
          }
          bVar14 = 0x44;
          lVar10 = 0;
LAB_00192991:
          if (0x3b < bVar14) {
            if (bVar14 == 0x3c) {
              if (pbVar35[1] == 0x3f) {
                pbVar35 = pbVar35 + 2;
                do {
                  if (*pbVar35 == 0x3f) {
                    if (pbVar35[1] == 0x3e) goto LAB_00192a9e;
                  }
                  else if (*pbVar35 == 0) goto LAB_00193088;
                  pbVar35 = pbVar35 + 1;
                } while( true );
              }
              if (pbVar35[1] == 0x21) {
                if (pbVar35[2] != 0x2d) {
                  if (pbVar35[2] == 0x5b) {
                    pbVar35 = pbVar35 + 3;
                    lVar25 = 0;
LAB_00192a19:
                    pbVar35 = pbVar35 + 3;
                    do {
                      bVar14 = pbVar35[-3];
                      if (bVar14 == 0x3c) {
                        if ((pbVar35[-2] == 0x21) && (pbVar35[-1] == 0x5b)) {
                          lVar25 = lVar25 + 1;
                          goto LAB_00192a19;
                        }
                      }
                      else if (bVar14 == 0x5d) {
                        if ((pbVar35[-2] == 0x5d) && (pbVar35[-1] == 0x3e)) goto LAB_00192a58;
                      }
                      else if (bVar14 == 0) {
                        iVar22 = 9;
                        pbVar35 = pbVar35 + -3;
                        goto LAB_001931f4;
                      }
                      pbVar35 = pbVar35 + 1;
                    } while( true );
                  }
                  pbVar35 = pbVar35 + 2;
                  lVar10 = lVar10 + 1;
                  goto LAB_00192a72;
                }
                if (pbVar35[3] == 0x2d) {
                  pbVar35 = pbVar35 + 4;
                  do {
                    if (*pbVar35 == 0x2d) {
                      if ((pbVar35[1] == 0x2d) && (pbVar35[2] == 0x3e)) goto LAB_00192ae2;
                    }
                    else if (*pbVar35 == 0) break;
                    pbVar35 = pbVar35 + 1;
                  } while( true );
                }
              }
LAB_00193088:
              iVar22 = 9;
              goto LAB_001931f4;
            }
            if (bVar14 == 0x3e) {
              if (lVar10 == 0) {
                *pbVar35 = 0;
                pbVar35 = pbVar35 + 1;
                goto LAB_00192f44;
              }
              lVar10 = lVar10 + -1;
            }
LAB_00192a6f:
            pbVar35 = pbVar35 + 1;
            goto LAB_00192a72;
          }
          if ((bVar14 == 0x22) || (bVar14 == 0x27)) {
            pbVar35 = pbVar35 + 1;
            do {
              pbVar34 = pbVar35;
              bVar15 = *pbVar34;
              pbVar35 = pbVar34 + 1;
              if (bVar15 == 0) break;
            } while (bVar15 != bVar14);
            if (bVar15 != 0) goto LAB_00192a72;
            iVar22 = 9;
            pbVar35 = pbVar34;
            goto LAB_001931f4;
          }
          if (bVar14 != 0) goto LAB_00192a6f;
          iVar22 = 9;
          if ((endch != 0x3e) || (lVar10 != 0)) goto LAB_001931f4;
LAB_00192f44:
          pbVar34 = pbVar35;
          if ((options >> 9 & 1) != 0) {
            pbVar31 = pbVar31 + 7;
            do {
              pbVar30 = pbVar31 + 1;
              pbVar31 = pbVar31 + 1;
            } while (((anonymous_namespace)::chartype_table[*pbVar30] & 8) != 0);
            pxVar9 = append_new_node(pxVar8,alloc,node_doctype);
            if (pxVar9 == (xml_node_struct *)0x0) {
              iVar22 = 3;
              goto LAB_001931f4;
            }
            pxVar9->value = (char_t *)pbVar31;
          }
          goto LAB_001922ec;
        }
      }
      iVar22 = 5;
      goto LAB_001931f4;
    }
    if (bVar14 == 0x3f) {
      pbVar30 = pbVar31 + 1;
      iVar22 = 6;
      pbVar35 = pbVar30;
      if (-1 < (char)(anonymous_namespace)::chartype_table[pbVar31[1]]) goto LAB_001931f4;
      lVar25 = 4;
      pbVar35 = pbVar31 + 3;
      lVar10 = 1;
      pbVar32 = pbVar31 + 1;
      do {
        pbVar34 = pbVar32;
        lVar29 = lVar10;
        pbVar20 = pbVar35;
        uVar27 = (ulong)*pbVar34;
        pbVar32 = pbVar34 + 1;
        lVar25 = lVar25 + -1;
        pbVar35 = pbVar20 + 1;
        lVar10 = lVar29 + 1;
      } while (((anonymous_namespace)::chartype_table[uVar27] & 0x40) != 0);
      pbVar35 = pbVar34;
      local_60 = pbVar30;
      if (*pbVar34 == 0) goto LAB_001931f4;
      pbVar35 = pbVar31 + lVar29;
      if (((pbVar31[1] & 0xdf) == 0x58) && ((pbVar31[2] & 0xdf) == 0x4d)) {
        bVar3 = (pbVar31[3] & 0xdf) != 0x4c;
        uVar21 = 1;
        if (lVar25 == 0 && !bVar3) {
          uVar21 = 0x100;
        }
        if ((options & uVar21) == 0) {
LAB_001927db:
          do {
            if ((char)uVar27 == '?') {
              bVar14 = pbVar34[1];
              if ((bVar14 == 0x3e) || ((endch ^ 0x3e) == 0 && bVar14 == 0)) goto LAB_00192c07;
            }
            else {
              pbVar35 = pbVar34;
              if ((int)uVar27 == 0) goto LAB_001931f4;
              bVar14 = pbVar34[1];
            }
            uVar27 = (ulong)bVar14;
            pbVar34 = pbVar34 + 1;
          } while( true );
        }
        if (lVar25 != 0 || bVar3) goto LAB_001928a4;
        if (pxVar8->parent != (xml_node_struct *)0x0) goto LAB_001931f4;
        pxVar8 = append_new_node(pxVar8,alloc,node_declaration);
        if (pxVar8 == (xml_node_struct *)0x0) goto LAB_00193154;
        bVar3 = true;
      }
      else {
        if ((options & 1) == 0) goto LAB_001927db;
LAB_001928a4:
        pxVar8 = append_new_node(pxVar8,alloc,node_pi);
        if (pxVar8 == (xml_node_struct *)0x0) {
LAB_00193154:
          iVar22 = 3;
          goto LAB_001931f4;
        }
        bVar3 = false;
      }
      pxVar8->name = (char_t *)local_60;
      bVar14 = *pbVar34;
      *pbVar34 = 0;
      if ((ulong)bVar14 == 0x3f) {
        bVar14 = *pbVar32;
        if ((bVar14 == 0x3e) || (bVar1 == 0 && bVar14 == 0)) {
          pbVar34 = pbVar32 + (bVar14 == 0x3e);
          pxVar8 = pxVar8->parent;
          goto LAB_00192c23;
        }
        pbVar35 = pbVar35 + 1;
      }
      else {
        pbVar35 = pbVar32;
        if (((anonymous_namespace)::chartype_table[bVar14] & 8) != 0) {
          do {
            pbVar30 = pbVar20;
            uVar27 = (ulong)pbVar34[1];
            pbVar34 = pbVar34 + 1;
            pbVar20 = pbVar30 + 1;
          } while (((anonymous_namespace)::chartype_table[uVar27] & 8) != 0);
          do {
            if ((char)uVar27 == '?') {
              bVar14 = *pbVar30;
              if ((bVar14 == 0x3e) || (bVar1 == 0 && bVar14 == 0)) goto LAB_00192e32;
            }
            else {
              if ((int)uVar27 == 0) {
                pbVar35 = pbVar30 + -1;
                break;
              }
              bVar14 = *pbVar30;
            }
            uVar27 = (ulong)bVar14;
            pbVar30 = pbVar30 + 1;
          } while( true );
        }
      }
      goto LAB_001931f4;
    }
    if (bVar14 != 0x2f) {
      iVar22 = (endch == 0x3f && bVar14 == 0) + 5;
      goto LAB_001931f4;
    }
    pbVar35 = pbVar31 + 1;
    pbVar34 = (byte *)pxVar8->name;
    pbVar30 = pbVar35;
    if (pbVar34 == (byte *)0x0) {
LAB_00193001:
      iVar22 = 0xe;
      goto LAB_001931f4;
    }
    while (bVar14 = *pbVar30, ((anonymous_namespace)::chartype_table[bVar14] & 0x40) != 0) {
      bVar15 = *pbVar34;
      pbVar34 = pbVar34 + 1;
      pbVar30 = pbVar30 + 1;
      if (bVar14 != bVar15) goto LAB_00193001;
    }
    if (*pbVar34 != 0) {
      iVar22 = 0xe;
      if (((bVar14 == 0) && (*pbVar34 == endch)) && (pbVar34[1] == 0)) {
LAB_00193308:
        iVar22 = 0xd;
        pbVar35 = pbVar30;
      }
      goto LAB_001931f4;
    }
    pxVar8 = pxVar8->parent;
    pbVar34 = pbVar30;
    do {
      pbVar30 = pbVar34;
      bVar14 = *pbVar30;
      pbVar34 = pbVar30 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar14] & 8) != 0);
    if (bVar14 == 0) goto LAB_00192bd9;
    if (bVar14 != 0x3e) goto LAB_00193308;
    goto LAB_001922ec;
  }
  pxVar8 = append_new_node(pxVar8,alloc,node_element);
  if (pxVar8 == (xml_node_struct *)0x0) {
    iVar22 = 3;
    goto LAB_001931f4;
  }
  pxVar8->name = (char_t *)pbVar31;
  pbVar34 = pbVar31 + 1;
  do {
    pbVar35 = pbVar34;
    uVar27 = (ulong)pbVar35[-1];
    bVar14 = (anonymous_namespace)::chartype_table[uVar27];
    if ((bVar14 & 0x40) == 0) {
      pbVar35 = pbVar35 + -1;
      goto LAB_0019284c;
    }
    uVar27 = (ulong)*pbVar35;
    bVar14 = (anonymous_namespace)::chartype_table[uVar27];
    if ((bVar14 & 0x40) == 0) goto LAB_0019284c;
    uVar27 = (ulong)pbVar35[1];
    bVar14 = (anonymous_namespace)::chartype_table[uVar27];
    if ((bVar14 & 0x40) == 0) {
      pbVar35 = pbVar35 + 1;
      goto LAB_0019284c;
    }
    uVar27 = (ulong)pbVar35[2];
    bVar14 = (anonymous_namespace)::chartype_table[uVar27];
    pbVar34 = pbVar35 + 4;
  } while ((bVar14 & 0x40) != 0);
  pbVar35 = pbVar35 + 2;
LAB_0019284c:
  *pbVar35 = 0;
  pbVar34 = pbVar35 + 1;
  if ((char)uVar27 == '>') goto LAB_001922ec;
  if ((bVar14 & 8) != 0) goto LAB_00192c3a;
  if ((char)uVar27 == '\0') {
    iVar22 = 0xb;
    pbVar34 = pbVar35;
    if (endch != 0x3e) goto LAB_001931f4;
    goto LAB_001922ec;
  }
  if ((int)uVar27 == 0x2f) {
    bVar14 = *pbVar34;
    if ((bVar14 != 0x3e) && (bVar1 != 0 || bVar14 != 0)) goto LAB_00193182;
    pxVar8 = pxVar8->parent;
    pbVar34 = pbVar34 + (bVar14 == 0x3e);
    goto LAB_001922ec;
  }
  goto LAB_00193182;
LAB_00192c07:
  pbVar34 = pbVar34 + (ulong)(bVar14 == 0x3e) + 1;
LAB_00192c23:
  if (pxVar8 == (xml_node_struct *)0x0) {
    __assert_fail("cursor",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                  ,0xd75,
                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                 );
  }
  goto LAB_00192c2c;
LAB_00192e32:
  if (!bVar3) {
    pxVar8->value = (char_t *)pbVar34;
    pxVar8 = pxVar8->parent;
    pbVar30[-1] = 0;
    pbVar34 = pbVar30 + (*pbVar30 == 0x3e);
    goto LAB_00192c23;
  }
  pbVar30[-1] = 0x2f;
LAB_00192c2c:
  if ((pxVar8->header & 0xf) != 7) goto LAB_001922ec;
LAB_00192c3a:
  while( true ) {
    do {
      pbVar35 = pbVar34;
      bVar14 = *pbVar35;
      pbVar34 = pbVar35 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar14] & 8) != 0);
    if (-1 < (char)(anonymous_namespace)::chartype_table[bVar14]) break;
    pxVar11 = append_new_attribute(pxVar8,alloc);
    if (pxVar11 == (xml_attribute_struct *)0x0) {
      iVar22 = 3;
      goto LAB_001931f4;
    }
    pxVar11->name = (char_t *)pbVar35;
    pbVar34 = pbVar35 + 1;
    do {
      pbVar35 = pbVar34;
      bVar14 = pbVar35[-1];
      bVar15 = (anonymous_namespace)::chartype_table[bVar14];
      if ((bVar15 & 0x40) == 0) {
        pbVar35 = pbVar35 + -1;
        goto LAB_00192cbb;
      }
      bVar14 = *pbVar35;
      bVar15 = (anonymous_namespace)::chartype_table[bVar14];
      if ((bVar15 & 0x40) == 0) goto LAB_00192cbb;
      bVar14 = pbVar35[1];
      bVar15 = (anonymous_namespace)::chartype_table[bVar14];
      if ((bVar15 & 0x40) == 0) {
        pbVar35 = pbVar35 + 1;
        goto LAB_00192cbb;
      }
      bVar14 = pbVar35[2];
      bVar15 = (anonymous_namespace)::chartype_table[bVar14];
      pbVar34 = pbVar35 + 4;
    } while ((bVar15 & 0x40) != 0);
    pbVar35 = pbVar35 + 2;
LAB_00192cbb:
    *pbVar35 = 0;
    while (pbVar35 = pbVar35 + 1, (bVar15 & 8) != 0) {
      bVar14 = *pbVar35;
      bVar15 = (anonymous_namespace)::chartype_table[bVar14];
    }
    if (bVar14 != 0x3d) {
      iVar22 = 0xc;
      goto LAB_001931f4;
    }
    do {
      pbVar34 = pbVar35;
      bVar14 = *pbVar34;
      pbVar30 = pbVar34 + 1;
      pbVar35 = pbVar30;
    } while (((anonymous_namespace)::chartype_table[bVar14] & 8) != 0);
    iVar22 = 0xc;
    if ((bVar14 != 0x22) && (pbVar35 = pbVar34, bVar14 != 0x27)) goto LAB_001931f4;
    pxVar11->value = (char_t *)pbVar30;
    pbVar35 = (byte *)(*local_48)(pbVar30,(int)(char)bVar14);
    if (pbVar35 == (byte *)0x0) {
      pbVar35 = (byte *)pxVar11->value;
      goto LAB_001931f4;
    }
    pbVar34 = pbVar35;
    if ((char)(anonymous_namespace)::chartype_table[*pbVar35] < '\0') goto LAB_001931f4;
  }
  if (bVar14 == 0x3e) goto LAB_001922ec;
  if (bVar14 != 0x2f) {
    iVar22 = 0xb;
    if ((endch != 0x3e) || (pbVar34 = pbVar35, bVar14 != 0)) goto LAB_001931f4;
    goto LAB_001922ec;
  }
  if (*pbVar34 == 0x3e) {
    pxVar8 = pxVar8->parent;
    pbVar34 = pbVar35 + 2;
    goto LAB_001922ec;
  }
  if ((endch == 0x3e) && (*pbVar34 == 0)) {
    pxVar8 = pxVar8->parent;
    goto LAB_001922ec;
  }
LAB_00193182:
  iVar22 = 0xb;
  pbVar35 = pbVar34;
  goto LAB_001931f4;
LAB_00192bd9:
  pbVar34 = pbVar30;
  if (endch != 0x3e) goto LAB_00193320;
  goto LAB_001922ec;
LAB_00193320:
  iVar22 = 0xd;
  pbVar35 = pbVar30;
LAB_001931f4:
  pxVar26 = (xml_parse_result *)(pbVar35 + -(long)local_40);
  if (pbVar35 == (byte *)0x0) {
    pxVar26 = (xml_parse_result *)0x0;
  }
  xml_parse_result::xml_parse_result((xml_parse_result *)&local_a8);
  pxVar5 = local_b0;
  local_a8 = (byte *)CONCAT44(local_a8._4_4_,iVar22);
  pxStack_a0 = pxVar26;
  if (((long)pxVar26 < 0) || (local_38 < pxVar26)) {
    __assert_fail("result.offset >= 0 && static_cast<size_t>(result.offset) <= length",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                  ,0xdff,
                  "static xml_parse_result pugi::impl::(anonymous namespace)::xml_parser::parse(char_t *, size_t, xml_document_struct *, xml_node_struct *, unsigned int)"
                 );
  }
  if (iVar22 == 0) {
    if (endch == 0x3c) {
      xml_parse_result::xml_parse_result(local_b0);
      pxVar5->status = status_unrecognized_tag;
      pxStack_a0 = local_80;
    }
    else {
      if ((options >> 0xc & 1) != 0) goto LAB_001932ac;
      ppxVar13 = &local_70->next_sibling;
      if (local_70 == (xml_node_struct *)0x0) {
        ppxVar13 = local_58;
      }
      for (pxVar8 = *ppxVar13; pxVar8 != (xml_node_struct *)0x0; pxVar8 = pxVar8->next_sibling) {
        if ((pxVar8->header & 0xf) == 2) goto LAB_001932ac;
      }
      xml_parse_result::xml_parse_result(local_b0);
      pxVar5->status = status_no_document_element;
      pxStack_a0 = local_80;
    }
  }
  else {
    if (((pxVar26 != (xml_parse_result *)0x0) && (pxVar26 == local_80)) && (endch == 0)) {
      pxStack_a0 = (xml_parse_result *)&local_38[-1].field_0x16;
    }
LAB_001932ac:
    local_b0->encoding = local_98;
    *(undefined4 *)&local_b0->field_0x14 = uStack_94;
    *(byte **)local_b0 = local_a8;
  }
  pxVar5->offset = (ptrdiff_t)pxStack_a0;
  goto LAB_001932e5;
LAB_00192ee6:
  *pbVar31 = 0;
LAB_00192eea:
  pbVar31 = pbVar31 + 1;
LAB_00192eed:
  pbVar34 = pbVar31 + (ulong)(pbVar31[1] == 0x3e) + 1;
  goto LAB_001922ec;
LAB_00192e69:
  if ((options & 2) != 0) {
    *pbVar31 = 0;
  }
  pbVar34 = pbVar31 + (ulong)(bVar14 == 0x3e) + 2;
  goto LAB_001922ec;
LAB_00192e87:
  pcVar12 = gap::flush((gap *)&local_a8,(char_t *)pbVar34);
  *pcVar12 = '\0';
  pbVar34 = pbVar34 + (ulong)(pbVar34[2] == 0x3e) + 2;
  goto LAB_001922ec;
LAB_00192a9e:
  pbVar35 = pbVar35 + 2;
  goto LAB_00192a72;
LAB_00192a58:
  if (lVar25 != 0) {
    lVar25 = lVar25 + -1;
    goto LAB_00192a19;
  }
  goto LAB_00192a72;
LAB_00192ae2:
  pbVar35 = pbVar35 + 3;
LAB_00192a72:
  bVar14 = *pbVar35;
  goto LAB_00192991;
}

Assistant:

PUGI_IMPL_FN xml_parse_result load_buffer_impl(xml_document_struct* doc, xml_node_struct* root, void* contents, size_t size, unsigned int options, xml_encoding encoding, bool is_mutable, bool own, char_t** out_buffer)
	{
		// check input buffer
		if (!contents && size) return make_parse_result(status_io_error);

		// get actual encoding
		xml_encoding buffer_encoding = impl::get_buffer_encoding(encoding, contents, size);

		// if convert_buffer below throws bad_alloc, we still need to deallocate contents if we own it
		auto_deleter<void> contents_guard(own ? contents : NULL, xml_memory::deallocate);

		// get private buffer
		char_t* buffer = NULL;
		size_t length = 0;

		// coverity[var_deref_model]
		if (!impl::convert_buffer(buffer, length, buffer_encoding, contents, size, is_mutable)) return impl::make_parse_result(status_out_of_memory);

		// after this we either deallocate contents (below) or hold on to it via doc->buffer, so we don't need to guard it
		contents_guard.release();

		// delete original buffer if we performed a conversion
		if (own && buffer != contents && contents) impl::xml_memory::deallocate(contents);

		// grab onto buffer if it's our buffer, user is responsible for deallocating contents himself
		if (own || buffer != contents) *out_buffer = buffer;

		// store buffer for offset_debug
		doc->buffer = buffer;

		// parse
		xml_parse_result res = impl::xml_parser::parse(buffer, length, doc, root, options);

		// remember encoding
		res.encoding = buffer_encoding;

		return res;
	}